

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_json_parser<char,_std::allocator<char>_>::check_done
          (basic_json_parser<char,_std::allocator<char>_> *this,error_code *ec)

{
  bool bVar1;
  byte *pbVar2;
  byte *pbVar3;
  json_errc local_2c;
  
  pbVar2 = (byte *)this->end_input_;
  pbVar3 = (byte *)this->input_ptr_;
  if (pbVar3 != pbVar2) {
    do {
      if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0)) {
        local_2c = extra_character;
        if ((this->err_handler_).super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        bVar1 = (*(this->err_handler_)._M_invoker)
                          ((_Any_data *)&this->err_handler_,&local_2c,&this->super_ser_context);
        this->more_ = bVar1;
        if (!bVar1) {
          std::error_code::operator=(ec,extra_character);
          return;
        }
        pbVar2 = (byte *)this->end_input_;
        pbVar3 = (byte *)this->input_ptr_;
      }
      pbVar3 = pbVar3 + 1;
      this->input_ptr_ = (char_type *)pbVar3;
    } while (pbVar3 != pbVar2);
  }
  return;
}

Assistant:

void check_done(std::error_code& ec)
    {
        for (; input_ptr_ != end_input_; ++input_ptr_)
        {
            char_type curr_char_ = *input_ptr_;
            switch (curr_char_)
            {
                case '\n':
                case '\r':
                case '\t':
                case ' ':
                    break;
                default:
                    more_ = err_handler_(json_errc::extra_character, *this);
                    if (!more_)
                    {
                        ec = json_errc::extra_character;
                        return;
                    }
                    break;
            }
        }
    }